

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

void Saig_SynchTernaryTransferState(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (0 < pAig->nRegs) {
    pVVar3 = pAig->vCos;
    iVar6 = 0;
    do {
      uVar7 = pAig->nTruePos + iVar6;
      if (((((int)uVar7 < 0) || (pVVar3->nSize <= (int)uVar7)) ||
          (uVar8 = pAig->nTruePis + iVar6, (int)uVar8 < 0)) || (pAig->vCis->nSize <= (int)uVar8)) {
LAB_006ee78c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pVVar3->pArray[uVar7] + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006ee78c;
      iVar2 = *(int *)((long)pAig->vCis->pArray[uVar8] + 0x24);
      if (((long)iVar2 < 0) || (vSimInfo->nSize <= iVar2)) goto LAB_006ee78c;
      if (0 < nWords) {
        pvVar4 = vSimInfo->pArray[iVar1];
        pvVar5 = vSimInfo->pArray[iVar2];
        uVar9 = 0;
        do {
          *(undefined4 *)((long)pvVar5 + uVar9 * 4) = *(undefined4 *)((long)pvVar4 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while ((uint)nWords != uVar9);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < pAig->nRegs);
  }
  return;
}

Assistant:

void Saig_SynchTernaryTransferState( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    unsigned * pSim0, * pSim1;
    int i, w;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim1[w] = pSim0[w];
    }
}